

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_test.cc
# Opt level: O3

void re2::TestRegexpCompileToProgSimple(void)

{
  char *__s;
  char *__s_00;
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  Regexp *this;
  Prog *this_00;
  Prog *pPVar5;
  long lVar6;
  string s;
  string local_1d0;
  char *local_1b0;
  ostream local_1a8 [376];
  size_t sVar4;
  
  iVar3 = 0;
  lVar6 = 8;
  do {
    __s = *(char **)((long)&__do_global_dtors_aux_fini_array_entry + lVar6);
    uVar1._0_1_ = (ostringstream)0x0;
    uVar1._1_3_ = 0;
    local_1b0 = __s;
    if (__s != (char *)0x0) {
      sVar4 = strlen(__s);
      uVar1 = (undefined4)sVar4;
    }
    local_1a8._0_4_ = uVar1;
    this = Regexp::Parse((StringPiece *)&local_1b0,PerlX|Latin1,(RegexpStatus *)0x0);
    if (this == (Regexp *)0x0) {
      LogMessage::LogMessage
                ((LogMessage *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/compile_test.cc"
                 ,0x79,2);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Cannot parse: ",0xe);
      if (__s == (char *)0x0) {
        std::ios::clear((int)local_1a8 +
                        (int)*(undefined8 *)(CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + -0x18));
      }
      else {
        sVar4 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,__s,sVar4);
      }
      LogMessage::~LogMessage((LogMessage *)&local_1b0);
LAB_00114ebf:
      iVar3 = iVar3 + 1;
    }
    else {
      this_00 = Regexp::CompileToProg(this,0);
      if (this_00 == (Prog *)0x0) {
        LogMessage::LogMessage
                  ((LogMessage *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/compile_test.cc"
                   ,0x7f,2);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Cannot compile: ",0x10);
        if (__s == (char *)0x0) {
          std::ios::clear((int)local_1a8 +
                          (int)*(undefined8 *)(CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + -0x18));
        }
        else {
          sVar4 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,__s,sVar4);
        }
        LogMessage::~LogMessage((LogMessage *)&local_1b0);
        Regexp::Decref(this);
        goto LAB_00114ebf;
      }
      pPVar5 = Regexp::CompileToProg(this,1);
      if (pPVar5 != (Prog *)0x0) {
        LogMessage::LogMessage
                  ((LogMessage *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/compile_test.cc"
                   ,0x84,3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,"Check failed: re->CompileToProg(1) == NULL",0x2a);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
      }
      Prog::Dump_abi_cxx11_(&local_1d0,this_00);
      __s_00 = *(char **)((long)&tests + lVar6);
      iVar2 = std::__cxx11::string::compare((char *)&local_1d0);
      if (iVar2 != 0) {
        LogMessage::LogMessage
                  ((LogMessage *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/compile_test.cc"
                   ,0x87,2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,"Incorrect compiled code for: ",0x1d);
        if (__s == (char *)0x0) {
          std::ios::clear((int)local_1a8 +
                          (int)*(undefined8 *)(CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + -0x18));
        }
        else {
          sVar4 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,__s,sVar4);
        }
        LogMessage::~LogMessage((LogMessage *)&local_1b0);
        LogMessage::LogMessage
                  ((LogMessage *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/compile_test.cc"
                   ,0x88,2);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Want:\n",6);
        if (__s_00 == (char *)0x0) {
          std::ios::clear((int)local_1a8 +
                          (int)*(undefined8 *)(CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + -0x18));
        }
        else {
          sVar4 = strlen(__s_00);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,__s_00,sVar4);
        }
        LogMessage::~LogMessage((LogMessage *)&local_1b0);
        LogMessage::LogMessage
                  ((LogMessage *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/compile_test.cc"
                   ,0x89,2);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Got:\n",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
        LogMessage::~LogMessage((LogMessage *)&local_1b0);
        iVar3 = iVar3 + 1;
      }
      Prog::~Prog(this_00);
      operator_delete(this_00);
      Regexp::Decref(this);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
    }
    lVar6 = lVar6 + 0x10;
    if (lVar6 == 0x168) {
      if (iVar3 != 0) {
        LogMessage::LogMessage
                  ((LogMessage *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/compile_test.cc"
                   ,0x8f,3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,"Check failed: (failed) == (0)",0x1d);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
      }
      return;
    }
  } while( true );
}

Assistant:

TEST(TestRegexpCompileToProg, Simple) {
  int failed = 0;
  for (int i = 0; i < arraysize(tests); i++) {
    const re2::Test& t = tests[i];
    Regexp* re = Regexp::Parse(t.regexp, Regexp::PerlX|Regexp::Latin1, NULL);
    if (re == NULL) {
      LOG(ERROR) << "Cannot parse: " << t.regexp;
      failed++;
      continue;
    }
    Prog* prog = re->CompileToProg(0);
    if (prog == NULL) {
      LOG(ERROR) << "Cannot compile: " << t.regexp;
      re->Decref();
      failed++;
      continue;
    }
    CHECK(re->CompileToProg(1) == NULL);
    string s = prog->Dump();
    if (s != t.code) {
      LOG(ERROR) << "Incorrect compiled code for: " << t.regexp;
      LOG(ERROR) << "Want:\n" << t.code;
      LOG(ERROR) << "Got:\n" << s;
      failed++;
    }
    delete prog;
    re->Decref();
  }
  EXPECT_EQ(failed, 0);
}